

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O3

Fl_Tree_Item * __thiscall
Fl_Tree_Item::add(Fl_Tree_Item *this,Fl_Tree_Prefs *prefs,char *new_label,Fl_Tree_Item *item)

{
  Fl_Tree_Sort FVar1;
  Fl_Tree_Item **ppFVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  if (item == (Fl_Tree_Item *)0x0) {
    item = (Fl_Tree_Item *)operator_new(0x88);
    Fl_Tree_Item(item,prefs);
    label(item,new_label);
  }
  item->_parent = this;
  FVar1 = prefs->_sortorder;
  if (FVar1 != FL_TREE_SORT_NONE) {
    if (FVar1 == FL_TREE_SORT_ASCENDING) {
      lVar6 = (long)(this->_children)._total;
      if (0 < lVar6) {
        ppFVar2 = (this->_children)._items;
        lVar5 = 0;
        do {
          pcVar3 = ppFVar2[lVar5]->_label;
          if ((pcVar3 != (char *)0x0) && (iVar4 = strcmp(pcVar3,new_label), 0 < iVar4))
          goto LAB_001da71b;
          lVar5 = lVar5 + 1;
        } while (lVar6 != lVar5);
      }
    }
    else {
      if (FVar1 != FL_TREE_SORT_DESCENDING) {
        return item;
      }
      lVar6 = (long)(this->_children)._total;
      if (0 < lVar6) {
        ppFVar2 = (this->_children)._items;
        lVar5 = 0;
        do {
          pcVar3 = ppFVar2[lVar5]->_label;
          if ((pcVar3 != (char *)0x0) && (iVar4 = strcmp(pcVar3,new_label), iVar4 < 0)) {
LAB_001da71b:
            Fl_Tree_Item_Array::insert(&this->_children,(int)lVar5,item);
            return item;
          }
          lVar5 = lVar5 + 1;
        } while (lVar6 != lVar5);
      }
    }
  }
  Fl_Tree_Item_Array::add(&this->_children,item);
  return item;
}

Assistant:

Fl_Tree_Item *Fl_Tree_Item::add(const Fl_Tree_Prefs &prefs,
			        const char *new_label,
				Fl_Tree_Item *item) {
#if FLTK_ABI_VERSION >= 10303
  if ( !item )
    { item = new Fl_Tree_Item(_tree); item->label(new_label); }
#else
  if ( !item )
    { item = new Fl_Tree_Item(prefs); item->label(new_label); }
#endif
  recalc_tree();		// may change tree geometry
  item->_parent = this;
  switch ( prefs.sortorder() ) {
    case FL_TREE_SORT_NONE: {
      _children.add(item);
      return(item);
    }
    case FL_TREE_SORT_ASCENDING: {
      for ( int t=0; t<_children.total(); t++ ) {
        Fl_Tree_Item *c = _children[t];
        if ( c->label() && strcmp(c->label(), new_label) > 0 ) {
          _children.insert(t, item);
          return(item);
        }
      }
      _children.add(item);
      return(item);
    }
    case FL_TREE_SORT_DESCENDING: {
      for ( int t=0; t<_children.total(); t++ ) {
        Fl_Tree_Item *c = _children[t];
        if ( c->label() && strcmp(c->label(), new_label) < 0 ) {
          _children.insert(t, item);
          return(item);
        }
      }
      _children.add(item);
      return(item);
    }
  }
  return(item);
}